

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prs.c
# Opt level: O1

void prsgdot(prscxdef *ctx,prsndef *n,int cnt)

{
  ushort uVar1;
  ushort uVar2;
  prsndef *n_00;
  prsndef *n_01;
  prsndef *ppVar3;
  emtcxdef *peVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  undefined2 uVar8;
  emtcxdef **ppeVar9;
  uchar uVar10;
  uint16_t tmp_1;
  uchar local_39;
  
  n_00 = (n->prsnv).prsnvn[0];
  n_01 = (n->prsnv).prsnvn[1];
  uVar10 = '(';
  if (n_00->prsnnlf == 1) {
    if (n_00->prsntyp == 0x20) {
      ppVar3 = (n_00->prsnv).prsnvn[0];
      prsdef(ctx,&(ppVar3->prsnv).prsnvt,7);
      uVar8 = *(undefined2 *)((long)&ppVar3->prsnv + 0x42);
      bVar5 = true;
      uVar10 = '/';
      local_39 = '.';
      bVar6 = false;
      bVar7 = false;
      goto LAB_0011ff89;
    }
LAB_0011ff78:
    local_39 = '\x12';
    bVar6 = false;
    goto switchD_0011ff2b_caseD_3;
  }
  if ((n_00->prsnnlf != 0) || ((n_00->prsnv).prsnvt.toktyp != 0x38)) goto LAB_0011ff78;
  local_39 = '\x12';
  bVar6 = false;
  switch((n_00->prsnv).prsnvt.toksym.tokstyp) {
  case '\x02':
  case '\a':
    local_39 = '>';
    bVar6 = true;
  default:
switchD_0011ff2b_caseD_3:
    bVar7 = true;
    uVar8 = 0;
    bVar5 = false;
    break;
  case '\x05':
    uVar10 = 'R';
    local_39 = '<';
    if ((ctx->prscxflg & 0x40) != 0) {
      errlogf(ctx->prscxerr,"TADS",0x158);
    }
    goto LAB_00120155;
  case '\t':
    uVar10 = '\'';
    local_39 = 'G';
LAB_00120155:
    bVar7 = true;
    bVar6 = false;
    uVar8 = 0;
    bVar5 = true;
  }
LAB_0011ff89:
  if (!bVar5 && !bVar6) {
    prsgexp(ctx,n_00);
  }
  if ((n_01->prsnnlf == 0) && ((n_01->prsnv).prsnvt.toktyp == 0x55)) {
    uVar1 = (n_01->prsnv).prsnvt.tokofs;
    ppeVar9 = &ctx->prscxemt;
    emtres(ctx->prscxemt,1);
    peVar4 = ctx->prscxemt;
    uVar2 = peVar4->emtcxofs;
    peVar4->emtcxofs = uVar2 + 1;
    peVar4->emtcxptr[uVar2] = local_39;
    emtres(ctx->prscxemt,1);
    peVar4 = ctx->prscxemt;
    uVar2 = peVar4->emtcxofs;
    peVar4->emtcxofs = uVar2 + 1;
    peVar4->emtcxptr[uVar2] = (uchar)cnt;
    if (bVar6) {
      emtres(*ppeVar9,2);
      *(undefined2 *)((*ppeVar9)->emtcxptr + (*ppeVar9)->emtcxofs) =
           *(undefined2 *)((long)&n_00->prsnv + 0x42);
      (*ppeVar9)->emtcxofs = (*ppeVar9)->emtcxofs + 2;
    }
    emtres(*ppeVar9,2);
    *(ushort *)((*ppeVar9)->emtcxptr + (*ppeVar9)->emtcxofs) = uVar1;
    (*ppeVar9)->emtcxofs = (*ppeVar9)->emtcxofs + 2;
  }
  else {
    if (bVar6) {
      prsgexp(ctx,n_00);
    }
    prsgexp(ctx,n_01);
    emtres(ctx->prscxemt,1);
    peVar4 = ctx->prscxemt;
    uVar2 = peVar4->emtcxofs;
    peVar4->emtcxofs = uVar2 + 1;
    peVar4->emtcxptr[uVar2] = uVar10;
    emtres(ctx->prscxemt,1);
    peVar4 = ctx->prscxemt;
    uVar2 = peVar4->emtcxofs;
    peVar4->emtcxofs = uVar2 + 1;
    peVar4->emtcxptr[uVar2] = (uchar)cnt;
  }
  if (!bVar7) {
    ppeVar9 = &ctx->prscxemt;
    emtres(*ppeVar9,2);
    *(undefined2 *)((*ppeVar9)->emtcxptr + (*ppeVar9)->emtcxofs) = uVar8;
    (*ppeVar9)->emtcxofs = (*ppeVar9)->emtcxofs + 2;
  }
  return;
}

Assistant:

static void prsgdot(prscxdef *ctx, prsndef *n, int cnt)
{
    prsndef *n0 = n->prsnv.prsnvn[0];
    prsndef *n1 = n->prsnv.prsnvn[1];
    int      inh;                                 /* flag: "inherited.prop" */
    int      slf;                                      /* flag: "self.prop" */
    int      objflg;           /* flag: LHS of dot is constant object value */
    int      exp_inh;                  /* flag: "inherited superclass.prop" */
    uchar    reg_op;                /* operator to use for regular property */
    uchar    ptr_op;                /* operator to use for property pointer */
    objnum   exp_inh_obj;     /* explicit superclass object to inherit from */

    /* presume we'll have a regular object expression for the LHS */
    inh = exp_inh = slf = objflg = FALSE;

    /* set up the default opcodes for ordinary object expressions */
    reg_op = OPCGETP;
    ptr_op = OPCPTRGETP;

    /* check for special left-hand-side values */
    if (n0->prsnnlf == 0 && n0->prsnv.prsnvt.toktyp == TOKTSYMBOL)
    {
        switch(n0->prsnv.prsnvt.toksym.tokstyp)
        {
        case TOKSTINHERIT:
            inh = TRUE;
            reg_op = OPCINHERIT;
            ptr_op = OPCPTRINH;
            break;
            
        case TOKSTSELF:
            if (ctx->prscxflg & PRSCXFFUNC) errlog(ctx->prscxerr, ERR_NOSELF);
            slf = TRUE;
            reg_op = OPCGETPSELF;
            ptr_op = OPCGETPPTRSELF;
            break;
            
        case TOKSTOBJ:
        case TOKSTFWDOBJ:
            objflg = TRUE;
            reg_op = OPCGETPOBJ;
            break;
        }
    }
    else if (n0->prsnnlf == 1 && n0->prsntyp == TOKTEXPINH)
    {
        tokdef *sc_tok;
        
        /* 
         *   explicit superclass inheritance - this is inheritance, but
         *   with an explicit superclass value 
         */
        inh = TRUE;
        exp_inh = TRUE;
        reg_op = OPCEXPINH;
        ptr_op = OPCEXPINHPTR;

        /* get the explicit superclass subnode */
        sc_tok = &n0->prsnv.prsnvn[0]->prsnv.prsnvt;

        /* make sure the superclass is an object */
        prsdef(ctx, sc_tok, TOKSTFWDOBJ);

        /* get the explicit superclass - it's the subnode */
        exp_inh_obj = sc_tok->toksym.toksval;
    }

    /* 
     *   push object whose property we're getting unless inheriting or
     *   getting a property of 'self' or of a fixed object (in which cases
     *   the object is implicit in the opcode, rather than being on the
     *   stack) 
     */
    if (!inh && !slf && !objflg)
        prsgexp(ctx, n0);

    if (n1->prsnnlf == 0
        && n1->prsnv.prsnvt.toktyp == TOKTPOUND)
    {
        /* RHS is a property symbol - do a simple GETP (or INHERIT) */
        prpnum prop = n1->prsnv.prsnvt.tokofs;

        /* 
         *   emit the opcode and argument count - use the regular
         *   (non-pointer) opcode, since we have a regular property value 
         */
        emtop(ctx->prscxemt, reg_op);
        emtbyte(ctx->prscxemt, cnt);

        /* if we are encoding the object in the instruction, emit it now */
        if (objflg)
            emtint2(ctx->prscxemt, n0->prsnv.prsnvt.toksym.toksval);

        /* add the property value */
        emtint2(ctx->prscxemt, prop);

        /* 
         *   if this is an "inherited" with an explicit superclass, add
         *   the explicit superclass value 
         */
        if (exp_inh)
            emtint2(ctx->prscxemt, exp_inh_obj);
    }
    else
    {
        /* 
         *   evaluate the LHS unconditionally, even if it's just a fixed
         *   object, since we have no special instruction that encodes an
         *   object value in a pointer property evaluation 
         */
        if (objflg)
            prsgexp(ctx, n0);

        /* RHS is an expression - evaluate it */
        prsgexp(ctx, n1);

        /* 
         *   emit the opcode and the byte count - use the pointer opcode,
         *   since we have a property pointer 
         */
        emtop(ctx->prscxemt, ptr_op);
        emtbyte(ctx->prscxemt, cnt);

        /* 
         *   if this is an "inherited" with an explicit superclass, add
         *   the explicit superclass value 
         */
        if (exp_inh)
            emtint2(ctx->prscxemt, exp_inh_obj);
    }
}